

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-stm.c
# Opt level: O0

int lnewwriter(lua_State *L)

{
  int iVar1;
  char *__src;
  undefined8 *puVar2;
  stm_object *psVar3;
  boxstm *box;
  char *tmp;
  size_t sz;
  void *msg;
  lua_State *L_local;
  
  msg = L;
  iVar1 = lua_isuserdata(L,1);
  if (iVar1 == 0) {
    __src = luaL_checklstring((lua_State *)msg,1,(size_t *)&tmp);
    sz = (size_t)malloc((size_t)tmp);
    memcpy((void *)sz,__src,(size_t)tmp);
  }
  else {
    sz = (size_t)lua_touserdata((lua_State *)msg,1);
    tmp = (char *)luaL_checkinteger((lua_State *)msg,2);
  }
  puVar2 = (undefined8 *)lua_newuserdata((lua_State *)msg,8);
  psVar3 = stm_new((void *)sz,(int32_t)tmp);
  *puVar2 = psVar3;
  lua_pushvalue((lua_State *)msg,-0xf4629);
  lua_setmetatable((lua_State *)msg,-2);
  return 1;
}

Assistant:

static int
lnewwriter(lua_State *L) {
	void * msg;
	size_t sz;
	if (lua_isuserdata(L,1)) {
		msg = lua_touserdata(L, 1);
		sz = (size_t)luaL_checkinteger(L, 2);
	} else {
		const char * tmp = luaL_checklstring(L,1,&sz);
		msg = skynet_malloc(sz);
		memcpy(msg, tmp, sz);
	}
	struct boxstm * box = lua_newuserdata(L, sizeof(*box));
	box->obj = stm_new(msg,sz);
	lua_pushvalue(L, lua_upvalueindex(1));
	lua_setmetatable(L, -2);

	return 1;
}